

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_dlmzb(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o;
  TCGv_i32 pTVar2;
  TCGTemp *local_38;
  long local_30;
  long local_28;
  TCGTemp *local_20;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  pTVar2 = tcg_const_i32_ppc64(tcg_ctx,ctx->opcode & 1);
  uVar1 = ctx->opcode;
  local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_30 = (long)&tcg_ctx->pool_cur + *(long *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8));
  local_28 = (long)&tcg_ctx->pool_cur + *(long *)((long)cpu_gpr + (ulong)(uVar1 >> 8 & 0xf8));
  local_20 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
  tcg_gen_callN_ppc64(tcg_ctx,helper_dlmzb_ppc64,
                      (TCGTemp *)
                      ((long)&tcg_ctx->pool_cur +
                      *(long *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8))),4,&local_38);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_dlmzb(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_const_i32(tcg_ctx, Rc(ctx->opcode));
    gen_helper_dlmzb(tcg_ctx, cpu_gpr[rA(ctx->opcode)], tcg_ctx->cpu_env,
                     cpu_gpr[rS(ctx->opcode)], cpu_gpr[rB(ctx->opcode)], t0);
    tcg_temp_free_i32(tcg_ctx, t0);
}